

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Select * sqlite3SelectDup(sqlite3 *db,Select *p,int flags)

{
  sqlite3_vfs *psVar1;
  SrcList *pSVar2;
  Expr *pEVar3;
  ExprList *pEVar4;
  Select *pSVar5;
  Select *pPrior;
  Select *pNew;
  int flags_local;
  Select *p_local;
  sqlite3 *db_local;
  
  if (p == (Select *)0x0) {
    db_local = (sqlite3 *)0x0;
  }
  else {
    db_local = (sqlite3 *)sqlite3DbMallocRaw(db,0x78);
    if (db_local == (sqlite3 *)0x0) {
      db_local = (sqlite3 *)0x0;
    }
    else {
      psVar1 = (sqlite3_vfs *)sqlite3ExprListDup(db,p->pEList,flags);
      db_local->pVfs = psVar1;
      pSVar2 = sqlite3SrcListDup(db,p->pSrc,flags);
      *(SrcList **)&db_local->nDb = pSVar2;
      pEVar3 = sqlite3ExprDup(db,p->pWhere,flags);
      db_local->lastRowid = (i64)pEVar3;
      pEVar4 = sqlite3ExprListDup(db,p->pGroupBy,flags);
      db_local->szMmap = (i64)pEVar4;
      pEVar3 = sqlite3ExprDup(db,p->pHaving,flags);
      *(Expr **)&db_local->openFlags = pEVar3;
      pEVar4 = sqlite3ExprListDup(db,p->pOrderBy,flags);
      *(ExprList **)&db_local->errMask = pEVar4;
      *(u8 *)&db_local->pVdbe = p->op;
      pSVar5 = sqlite3SelectDup(db,p->pPrior,flags);
      *(Select **)&db_local->mallocFailed = pSVar5;
      if (pSVar5 != (Select *)0x0) {
        pSVar5->pNext = (Select *)db_local;
      }
      *(Select **)&db_local->nextPagesize = (Select *)0x0;
      pEVar3 = sqlite3ExprDup(db,p->pLimit,flags);
      *(Expr **)db_local->aLimit = pEVar3;
      pEVar3 = sqlite3ExprDup(db,p->pOffset,flags);
      *(Expr **)((long)db_local->aLimit + 8) = pEVar3;
      *(int *)((long)&db_local->pVdbe + 4) = 0;
      *(int *)&db_local->pDfltColl = 0;
      *(u16 *)((long)&db_local->pVdbe + 2) = p->selFlags & 0xfff7;
      *(Select **)&db_local->nChange = (Select *)0x0;
      *(int *)((long)&db_local->pDfltColl + 4) = -1;
      *(undefined4 *)&db_local->mutex = 0xffffffff;
      *(int *)((long)&db_local->mutex + 4) = -1;
    }
  }
  return (Select *)db_local;
}

Assistant:

SQLITE_PRIVATE Select *sqlite3SelectDup(sqlite3 *db, Select *p, int flags){
  Select *pNew, *pPrior;
  if( p==0 ) return 0;
  pNew = sqlite3DbMallocRaw(db, sizeof(*p) );
  if( pNew==0 ) return 0;
  pNew->pEList = sqlite3ExprListDup(db, p->pEList, flags);
  pNew->pSrc = sqlite3SrcListDup(db, p->pSrc, flags);
  pNew->pWhere = sqlite3ExprDup(db, p->pWhere, flags);
  pNew->pGroupBy = sqlite3ExprListDup(db, p->pGroupBy, flags);
  pNew->pHaving = sqlite3ExprDup(db, p->pHaving, flags);
  pNew->pOrderBy = sqlite3ExprListDup(db, p->pOrderBy, flags);
  pNew->op = p->op;
  pNew->pPrior = pPrior = sqlite3SelectDup(db, p->pPrior, flags);
  if( pPrior ) pPrior->pNext = pNew;
  pNew->pNext = 0;
  pNew->pLimit = sqlite3ExprDup(db, p->pLimit, flags);
  pNew->pOffset = sqlite3ExprDup(db, p->pOffset, flags);
  pNew->iLimit = 0;
  pNew->iOffset = 0;
  pNew->selFlags = p->selFlags & ~SF_UsesEphemeral;
  pNew->pRightmost = 0;
  pNew->addrOpenEphm[0] = -1;
  pNew->addrOpenEphm[1] = -1;
  pNew->addrOpenEphm[2] = -1;
  return pNew;
}